

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

int countzerobits(bitmap bmp,int from,int to)

{
  int j;
  int z;
  int to_local;
  int from_local;
  bitmap bmp_local;
  
  z = 0;
  for (j = from; j < to; j = j + 1) {
    if (((uint)bmp[j >> 3] & 0x80 >> ((byte)j & 7)) == 0) {
      z = z + 1;
    }
  }
  return z;
}

Assistant:

int countzerobits(bitmap bmp, int from, int to){
  int z=0;
  for(int j=from;j<to;j++){
    if(!getbit(j,bmp)){
      z++;
    }
  }
  return z;
}